

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O3

bool __thiscall
node::BlockManager::UndoWriteToDisk
          (BlockManager *this,CBlockUndo *blockundo,FlatFilePos *pos,uint256 *hashBlock)

{
  undefined8 uVar1;
  FILE *__stream;
  long lVar2;
  uint256 *__n;
  bool bVar3;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  HashWriter hasher;
  char *in_stack_ffffffffffffff10;
  uint256 local_c8;
  undefined1 local_a8 [16];
  pointer local_98;
  uint32_t auStack_90 [2];
  uchar local_88 [80];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __n = hashBlock;
  __stream = (FILE *)FlatFileSeq::Open(&this->m_undo_file_seq,pos,false);
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)local_a8,&this->m_xor_key);
  if (__stream == (FILE *)0x0) {
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file._M_len = 0x5e;
    logging_function._M_str = "UndoWriteToDisk";
    logging_function._M_len = 0xf;
    LogPrintf_<char[16]>
              (logging_function,source_file,0x2a5,
               IPC|I2P|VALIDATION|LEVELDB|QT|LIBEVENT|PRUNE|RAND|REINDEX|ADDRMAN|ESTIMATEFEE|RPC|ZMQ
               |BENCH|TOR,0xfa6ba2,in_stack_ffffffffffffff10,(char (*) [16])0x0);
  }
  else {
    local_a8._0_8_ = (pointer)0x0;
    VectorFormatter<DefaultFormatter>::
    Ser<SizeComputer,std::vector<CTxUndo,std::allocator<CTxUndo>>>
              ((VectorFormatter<DefaultFormatter> *)&local_c8,(SizeComputer *)local_a8,
               &blockundo->vtxundo);
    uVar1 = local_a8._0_8_;
    AutoFile::write((AutoFile *)&stack0xffffffffffffff18,(int)(this->m_opts).chainparams + 0x170,
                    (void *)0x4,(size_t)__n);
    local_a8._0_4_ = (int)uVar1;
    AutoFile::write((AutoFile *)&stack0xffffffffffffff18,(int)local_a8,(void *)0x4,(size_t)__n);
    lVar2 = ftell(__stream);
    if (-1 < lVar2) {
      pos->nPos = (uint)lVar2;
      VectorFormatter<DefaultFormatter>::Ser<AutoFile,std::vector<CTxUndo,std::allocator<CTxUndo>>>
                ((VectorFormatter<DefaultFormatter> *)local_a8,(AutoFile *)&stack0xffffffffffffff18,
                 &blockundo->vtxundo);
      local_88[0x30] = '\0';
      local_88[0x31] = '\0';
      local_88[0x32] = '\0';
      local_88[0x33] = '\0';
      local_88[0x34] = '\0';
      local_88[0x35] = '\0';
      local_88[0x36] = '\0';
      local_88[0x37] = '\0';
      local_88[0x38] = '\0';
      local_88[0x39] = '\0';
      local_88[0x3a] = '\0';
      local_88[0x3b] = '\0';
      local_88[0x3c] = '\0';
      local_88[0x3d] = '\0';
      local_88[0x3e] = '\0';
      local_88[0x3f] = '\0';
      local_88[0x20] = '\0';
      local_88[0x21] = '\0';
      local_88[0x22] = '\0';
      local_88[0x23] = '\0';
      local_88[0x24] = '\0';
      local_88[0x25] = '\0';
      local_88[0x26] = '\0';
      local_88[0x27] = '\0';
      local_88[0x28] = '\0';
      local_88[0x29] = '\0';
      local_88[0x2a] = '\0';
      local_88[0x2b] = '\0';
      local_88[0x2c] = '\0';
      local_88[0x2d] = '\0';
      local_88[0x2e] = '\0';
      local_88[0x2f] = '\0';
      local_88[0x10] = '\0';
      local_88[0x11] = '\0';
      local_88[0x12] = '\0';
      local_88[0x13] = '\0';
      local_88[0x14] = '\0';
      local_88[0x15] = '\0';
      local_88[0x16] = '\0';
      local_88[0x17] = '\0';
      local_88[0x18] = '\0';
      local_88[0x19] = '\0';
      local_88[0x1a] = '\0';
      local_88[0x1b] = '\0';
      local_88[0x1c] = '\0';
      local_88[0x1d] = '\0';
      local_88[0x1e] = '\0';
      local_88[0x1f] = '\0';
      local_88[0] = '\0';
      local_88[1] = '\0';
      local_88[2] = '\0';
      local_88[3] = '\0';
      local_88[4] = '\0';
      local_88[5] = '\0';
      local_88[6] = '\0';
      local_88[7] = '\0';
      local_88[8] = '\0';
      local_88[9] = '\0';
      local_88[10] = '\0';
      local_88[0xb] = '\0';
      local_88[0xc] = '\0';
      local_88[0xd] = '\0';
      local_88[0xe] = '\0';
      local_88[0xf] = '\0';
      local_98 = (pointer)0x0;
      auStack_90[0] = 0;
      auStack_90[1] = 0;
      local_a8._0_8_ = (pointer)0x0;
      local_a8._8_8_ = (pointer)0x0;
      local_88[0x40] = '\0';
      local_88[0x41] = '\0';
      local_88[0x42] = '\0';
      local_88[0x43] = '\0';
      local_88[0x44] = '\0';
      local_88[0x45] = '\0';
      local_88[0x46] = '\0';
      local_88[0x47] = '\0';
      CSHA256::CSHA256((CSHA256 *)local_a8);
      CSHA256::Write((CSHA256 *)local_a8,(uchar *)hashBlock,0x20);
      VectorFormatter<DefaultFormatter>::
      Ser<HashWriter,std::vector<CTxUndo,std::allocator<CTxUndo>>>
                ((VectorFormatter<DefaultFormatter> *)&local_c8,(HashWriter *)local_a8,
                 &blockundo->vtxundo);
      HashWriter::GetHash(&local_c8,(HashWriter *)local_a8);
      AutoFile::write((AutoFile *)&stack0xffffffffffffff18,(int)&local_c8,(void *)0x20,(size_t)__n);
      bVar3 = true;
      goto LAB_0091d237;
    }
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file_00._M_len = 0x5e;
    logging_function_00._M_str = "UndoWriteToDisk";
    logging_function_00._M_len = 0xf;
    LogPrintf_<char[16]>
              (logging_function_00,source_file_00,0x2b0,
               IPC|I2P|VALIDATION|LEVELDB|QT|LIBEVENT|PRUNE|RAND|REINDEX|ADDRMAN|ESTIMATEFEE|RPC|
               WALLETDB|HTTP|TOR|NET,0xfa6ba2,in_stack_ffffffffffffff10,(char (*) [16])__stream);
  }
  bVar3 = false;
LAB_0091d237:
  AutoFile::~AutoFile((AutoFile *)&stack0xffffffffffffff18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockManager::UndoWriteToDisk(const CBlockUndo& blockundo, FlatFilePos& pos, const uint256& hashBlock) const
{
    // Open history file to append
    AutoFile fileout{OpenUndoFile(pos)};
    if (fileout.IsNull()) {
        LogError("%s: OpenUndoFile failed\n", __func__);
        return false;
    }

    // Write index header
    unsigned int nSize = GetSerializeSize(blockundo);
    fileout << GetParams().MessageStart() << nSize;

    // Write undo data
    long fileOutPos = ftell(fileout.Get());
    if (fileOutPos < 0) {
        LogError("%s: ftell failed\n", __func__);
        return false;
    }
    pos.nPos = (unsigned int)fileOutPos;
    fileout << blockundo;

    // calculate & write checksum
    HashWriter hasher{};
    hasher << hashBlock;
    hasher << blockundo;
    fileout << hasher.GetHash();

    return true;
}